

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# memory_tree.cc
# Opt level: O3

void memory_tree_ns::finish(memory_tree *b)

{
  void *__ptr;
  example *peVar1;
  example **__ptr_00;
  ulong uVar2;
  undefined8 *puVar3;
  node *__ptr_01;
  long lVar4;
  
  __ptr_01 = (b->nodes)._begin;
  if ((b->nodes)._end != __ptr_01) {
    lVar4 = 0x28;
    uVar2 = 0;
    do {
      __ptr = *(void **)((long)&__ptr_01->parent + lVar4);
      if (__ptr != (void *)0x0) {
        free(__ptr);
      }
      puVar3 = (undefined8 *)((long)&__ptr_01->parent + lVar4);
      *puVar3 = 0;
      puVar3[1] = 0;
      puVar3[2] = 0;
      uVar2 = uVar2 + 1;
      __ptr_01 = (b->nodes)._begin;
      lVar4 = lVar4 + 0x48;
    } while (uVar2 < (ulong)(((long)(b->nodes)._end - (long)__ptr_01 >> 3) * -0x71c71c71c71c71c7));
  }
  if (__ptr_01 != (node *)0x0) {
    free(__ptr_01);
  }
  (b->nodes)._begin = (node *)0x0;
  (b->nodes)._end = (node *)0x0;
  (b->nodes).end_array = (node *)0x0;
  __ptr_00 = (b->examples)._begin;
  if ((b->examples)._end != __ptr_00) {
    uVar2 = 0;
    do {
      peVar1 = __ptr_00[uVar2];
      VW::dealloc_example((_func_void_void_ptr *)0x0,peVar1,(_func_void_void_ptr *)0x0);
      free(peVar1);
      uVar2 = uVar2 + 1;
      __ptr_00 = (b->examples)._begin;
    } while (uVar2 < (ulong)((long)(b->examples)._end - (long)__ptr_00 >> 3));
  }
  if (__ptr_00 != (example **)0x0) {
    free(__ptr_00);
  }
  (b->examples)._begin = (example **)0x0;
  (b->examples)._end = (example **)0x0;
  (b->examples).end_array = (example **)0x0;
  peVar1 = b->kprod_ec;
  VW::dealloc_example((_func_void_void_ptr *)0x0,peVar1,(_func_void_void_ptr *)0x0);
  free(peVar1);
  return;
}

Assistant:

void finish(memory_tree& b)
    {
        for (size_t i = 0; i < b.nodes.size(); ++i)
            b.nodes[i].examples_index.delete_v();
        b.nodes.delete_v();
        for (size_t i = 0; i < b.examples.size(); i++)
            free_example(b.examples[i]);
        b.examples.delete_v();
        free_example(b.kprod_ec);
        //cout<<b.max_nodes<<endl;
        //cout<<b.construct_time<<" "<<b.test_time<<endl;
    }